

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_TwoSetsOfIdenticalSequences_SameFourSequences_Test::
TEST_DoublingFactorCounterTest_TwoSetsOfIdenticalSequences_SameFourSequences_Test
          (TEST_DoublingFactorCounterTest_TwoSetsOfIdenticalSequences_SameFourSequences_Test *this)

{
  TEST_DoublingFactorCounterTest_TwoSetsOfIdenticalSequences_SameFourSequences_Test *this_local;
  
  memset(this,0,0xc0);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest);
  (this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).super_Utest._vptr_Utest =
       (_func_int **)
       &
       PTR__TEST_DoublingFactorCounterTest_TwoSetsOfIdenticalSequences_SameFourSequences_Test_00251e28
  ;
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, TwoSetsOfIdenticalSequences_SameFourSequences)
{
	addPair(Tile::SouthWind);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfCircles, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::TwoSetsOfIdenticalSequences));
}